

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ConvolutionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_convolution(NeuralNetworkLayer *this)

{
  bool bVar1;
  ConvolutionLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_convolution(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_convolution(this);
    this_00 = (ConvolutionLayerParams *)operator_new(0xb0);
    ConvolutionLayerParams::ConvolutionLayerParams(this_00);
    (this->layer_).convolution_ = this_00;
  }
  return (this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ConvolutionLayerParams* NeuralNetworkLayer::mutable_convolution() {
  if (!has_convolution()) {
    clear_layer();
    set_has_convolution();
    layer_.convolution_ = new ::CoreML::Specification::ConvolutionLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.convolution)
  return layer_.convolution_;
}